

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.cpp
# Opt level: O0

void compute_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int j_1;
  int j;
  int i;
  float *iimage_data;
  int height_limit;
  int width_limit;
  int width;
  int data_width;
  float sum1;
  float sum;
  integral_image *iimage_local;
  float *gray_image_local;
  
  sum = 0.0;
  sum1 = 0.0;
  iVar2 = iimage->data_width;
  iVar3 = iimage->width;
  iVar6 = iVar3 + -2;
  iVar4 = iimage->height;
  pfVar5 = iimage->data;
  for (i = 0; i < iVar6; i = i + 2) {
    fVar1 = gray_image[i];
    pfVar5[i] = fVar1 + sum;
    sum = gray_image[i + 1] + fVar1 + sum;
    pfVar5[i + 1] = sum;
    fVar1 = gray_image[iVar3 + i];
    pfVar5[iVar2 + i] = pfVar5[i] + fVar1 + sum1;
    sum1 = gray_image[iVar3 + i + 1] + fVar1 + sum1;
    pfVar5[iVar2 + i + 1] = pfVar5[i + 1] + sum1;
  }
  for (; i < iVar3; i = i + 1) {
    sum = gray_image[i] + sum;
    pfVar5[i] = sum;
    sum1 = gray_image[iVar3 + i] + sum1;
    pfVar5[iVar2 + i] = pfVar5[i] + sum1;
  }
  for (i = 2; i < iVar4 + -2; i = i + 2) {
    sum = 0.0;
    sum1 = 0.0;
    for (j = 0; j < iVar6; j = j + 2) {
      fVar1 = gray_image[i * iVar3 + j];
      pfVar5[i * iVar2 + j] = pfVar5[(i + -1) * iVar2 + j] + fVar1 + sum;
      sum = gray_image[i * iVar3 + j + 1] + fVar1 + sum;
      pfVar5[i * iVar2 + j + 1] = pfVar5[(i + -1) * iVar2 + j + 1] + sum;
      fVar1 = gray_image[(i + 1) * iVar3 + j];
      pfVar5[(i + 1) * iVar2 + j] = pfVar5[i * iVar2 + j] + fVar1 + sum1;
      sum1 = gray_image[(i + 1) * iVar3 + j + 1] + fVar1 + sum1;
      pfVar5[(i + 1) * iVar2 + j + 1] = pfVar5[i * iVar2 + j + 1] + sum1;
    }
    for (; j < iVar3; j = j + 1) {
      sum = gray_image[i * iVar3 + j] + sum;
      pfVar5[i * iVar2 + j] = pfVar5[(i + -1) * iVar2 + j] + sum;
      sum1 = gray_image[(i + 1) * iVar3 + j] + sum1;
      pfVar5[(i + 1) * iVar2 + j] = pfVar5[i * iVar2 + j] + sum1;
    }
  }
  for (; i < iimage->height; i = i + 1) {
    sum = 0.0;
    for (j_1 = 0; j_1 < iVar6; j_1 = j_1 + 2) {
      fVar1 = gray_image[i * iVar3 + j_1];
      pfVar5[i * iVar2 + j_1] = pfVar5[(i + -1) * iVar2 + j_1] + fVar1 + sum;
      sum = gray_image[i * iVar3 + j_1 + 1] + fVar1 + sum;
      pfVar5[i * iVar2 + j_1 + 1] = pfVar5[(i + -1) * iVar2 + j_1 + 1] + sum;
    }
    for (; j_1 < iVar3; j_1 = j_1 + 1) {
      sum = gray_image[i * iVar3 + j_1] + sum;
      pfVar5[i * iVar2 + j_1] = pfVar5[(i + -1) * iVar2 + j_1] + sum;
    }
  }
  return;
}

Assistant:

void compute_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float sum = 0.0f;
    float sum1 = 0.0f;
    
    int data_width = iimage->data_width;
    int width = iimage->width;
    int width_limit = width - 2;
    int height_limit = iimage->height - 2;
    float *iimage_data = iimage->data;

    int i = 0;
    // first row extra, since we don't have 0 padding
    for (i = 0; i < width_limit; i += 2) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        sum += gray_image[i + 1];
        iimage_data[i + 1] = sum;

        sum1 += gray_image[width + i];
        iimage_data[data_width + i] = iimage_data[i] + sum1;
        sum1 += gray_image[width + i + 1];
        iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
    }

    // Handle last element of an image with odd width extra.
    // If previous stride = 2, then there should only be one element covered in this loop.
    // This might change if we increase the stride.
    for (; i < width; ++i) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        // printf("row 0, col %i sum: %f\n", i, sum);
        sum1 += gray_image[width + i];
        // printf("row 1, col %i sum: %f\n", i, sum1);
        iimage_data[data_width + i] = iimage_data[i] + sum1;
    }

    // Handle all elements after the first row.
    i = 2;
    for (; i < height_limit; i += 2) {
        sum = 0.0f;
        sum1 = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            sum1 += gray_image[(i + 1) * width + j + 1];
            iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
        }
        // printf("j: %i\n", j);

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; j < width; ++j) {
            // printf("j: %i; sum1: %f\n", j, sum1);
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            // printf("sum1: %f\n", sum1);
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
        }
    }

    // Handle last element of an image with odd height extra.
    // If previous stride = 2, then there should only be one row covered in this loop.
    // This might change if we increase the stride.
    for (; i < iimage->height ; ++i) {
        sum = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            // printf("j: %i; sum1: %f\n", j, sum);

            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
        }
        // printf("j: %i\n", j);

        for (; j < width; ++j) {
            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
        }
    }
}